

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsSparseMatrix.cpp
# Opt level: O0

void __thiscall
HighsSparseMatrix::priceByRowWithSwitch
          (HighsSparseMatrix *this,bool quad_precision,HVector *result,HVector *column,
          double expected_density,HighsInt from_index,double switch_density,HighsInt debug_report)

{
  int iVar1;
  const_reference pvVar2;
  const_reference pvVar3;
  reference this_00;
  reference pvVar4;
  reference pvVar5;
  size_type sVar6;
  long in_RCX;
  long in_RDX;
  byte in_SIL;
  vector<HighsCDouble,_std::allocator<HighsCDouble>_> *in_RDI;
  int in_R8D;
  int in_R9D;
  undefined4 in_XMM0_Da;
  undefined4 in_XMM0_Db;
  double in_XMM1_Qa;
  HighsInt iRow_1;
  HighsInt i;
  HighsInt result_num_nz;
  double value1_2;
  HighsInt iCol_2;
  double value1_1;
  HighsInt iCol_1;
  vector<HighsCDouble,_std::allocator<HighsCDouble>_> result_array;
  double value1;
  double value0;
  HighsInt iCol;
  HighsInt iEl_1;
  HighsInt iEl;
  double multiplier;
  bool switch_to_dense;
  double local_density;
  HighsInt row_num_nz;
  HighsInt to_iEl;
  HighsInt iRow;
  HighsInt ix;
  double inv_num_col;
  HighsInt next_index;
  HighsSparseVectorSum sum;
  HighsInt in_stack_fffffffffffffe6c;
  HighsSparseVectorSum *in_stack_fffffffffffffe70;
  undefined4 in_stack_fffffffffffffe78;
  undefined4 in_stack_fffffffffffffe7c;
  int iVar7;
  vector<HighsCDouble,_std::allocator<HighsCDouble>_> *in_stack_fffffffffffffe80;
  vector<HighsCDouble,_std::allocator<HighsCDouble>_> *pvVar8;
  undefined4 in_stack_fffffffffffffe88;
  undefined4 in_stack_fffffffffffffe8c;
  vector<int,_std::allocator<int>_> *in_stack_fffffffffffffe90;
  HVectorBase<double> *in_stack_fffffffffffffe98;
  HVectorBase<double> *in_stack_fffffffffffffea0;
  HVector *in_stack_fffffffffffffeb0;
  vector<HighsCDouble,_std::allocator<HighsCDouble>_> *in_stack_fffffffffffffeb8;
  HVector *in_stack_fffffffffffffec0;
  HighsInt in_stack_fffffffffffffec8;
  value_type in_stack_fffffffffffffecc;
  value_type in_stack_fffffffffffffed0;
  undefined3 uVar9;
  undefined4 in_stack_fffffffffffffed4;
  undefined4 in_stack_fffffffffffffee0;
  undefined4 in_stack_fffffffffffffee4;
  value_type vVar10;
  int local_118;
  int local_104;
  int local_f4;
  vector<HighsCDouble,_std::allocator<HighsCDouble>_> local_f0;
  HVectorBase<double> *local_d0;
  vector<HighsCDouble,_std::allocator<HighsCDouble>_> *local_c8;
  int local_bc;
  int local_b8;
  int local_b4;
  HVector *local_b0;
  char local_a1;
  double local_a0;
  int local_98;
  value_type local_94;
  int local_90;
  int local_8c;
  double local_88;
  int local_80;
  int local_3c;
  double local_38;
  int local_2c;
  double local_28;
  long local_20;
  long local_18;
  byte local_9;
  
  local_9 = in_SIL & 1;
  local_28 = (double)CONCAT44(in_XMM0_Db,in_XMM0_Da);
  local_3c = in_R9D;
  local_38 = in_XMM1_Qa;
  local_2c = in_R8D;
  local_20 = in_RCX;
  local_18 = in_RDX;
  HighsSparseVectorSum::HighsSparseVectorSum(in_stack_fffffffffffffe70);
  if ((local_9 & 1) != 0) {
    HighsSparseVectorSum::setDimension(in_stack_fffffffffffffe70,in_stack_fffffffffffffe6c);
  }
  if (-2 < local_3c) {
    printf("\nHighsSparseMatrix::priceByRowWithSwitch\n");
  }
  local_80 = local_2c;
  if (local_28 <= 0.1) {
    local_88 = 1.0 / (double)*(int *)((long)&(in_RDI->
                                             super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>
                                             )._M_impl.super__Vector_impl_data._M_start + 4);
    while (local_8c = local_80, local_80 < *(int *)(local_20 + 4)) {
      pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)(local_20 + 8),(long)local_80);
      local_90 = *pvVar2;
      if (*(int *)&(in_RDI->super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>)._M_impl
                   .super__Vector_impl_data._M_start == 3) {
        pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)
                            &in_RDI[1].
                             super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>._M_impl
                             .super__Vector_impl_data._M_end_of_storage,(long)local_90);
        local_94 = *pvVar2;
      }
      else {
        pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)
                            &(in_RDI->
                             super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>).
                             _M_impl.super__Vector_impl_data._M_end_of_storage,(long)(local_90 + 1))
        ;
        local_94 = *pvVar2;
      }
      in_stack_fffffffffffffed0 = local_94;
      pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)
                          &(in_RDI->super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>)
                           ._M_impl.super__Vector_impl_data._M_end_of_storage,(long)local_90);
      local_98 = in_stack_fffffffffffffed0 - *pvVar2;
      local_a0 = (double)*(int *)(local_18 + 4) * 1.0 * local_88;
      uVar9 = (undefined3)in_stack_fffffffffffffed4;
      in_stack_fffffffffffffed4 = CONCAT13(1,uVar9);
      if (*(int *)(local_18 + 4) + local_98 <
          *(int *)((long)&(in_RDI->super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>).
                          _M_impl.super__Vector_impl_data._M_start + 4)) {
        in_stack_fffffffffffffed4 = CONCAT13(local_38 < local_a0,uVar9);
      }
      local_a1 = (char)((uint)in_stack_fffffffffffffed4 >> 0x18);
      if (local_a1 != '\0') break;
      pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(local_20 + 0x20),
                          (long)local_90);
      local_b0 = (HVector *)*pvVar3;
      if ((local_3c == -1) || (local_3c == local_90)) {
        debugReportRowPrice((HighsSparseMatrix *)
                            CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                            in_stack_fffffffffffffecc,(double)in_stack_fffffffffffffec0,
                            (HighsInt)((ulong)in_stack_fffffffffffffeb8 >> 0x20),
                            (vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffeb0);
      }
      if (((double)local_b0 != 0.0) || (NAN((double)local_b0))) {
        if ((local_9 & 1) == 0) {
          pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                             ((vector<int,_std::allocator<int>_> *)
                              &(in_RDI->
                               super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>).
                               _M_impl.super__Vector_impl_data._M_end_of_storage,(long)local_90);
          for (local_b8 = *pvVar2; local_b8 < local_94; local_b8 = local_b8 + 1) {
            pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                               ((vector<int,_std::allocator<int>_> *)
                                &in_RDI[2].
                                 super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage,(long)local_b8);
            local_bc = *pvVar2;
            pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                               ((vector<double,_std::allocator<double>_> *)(local_18 + 0x20),
                                (long)local_bc);
            in_stack_fffffffffffffeb8 =
                 (vector<HighsCDouble,_std::allocator<HighsCDouble>_> *)*pvVar4;
            in_stack_fffffffffffffeb0 = local_b0;
            local_c8 = in_stack_fffffffffffffeb8;
            pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                               ((vector<double,_std::allocator<double>_> *)
                                &in_RDI[3].
                                 super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage,(long)local_b8);
            iVar1 = local_bc;
            local_d0 = (HVectorBase<double> *)
                       ((double)in_stack_fffffffffffffeb0 * *pvVar3 +
                       (double)in_stack_fffffffffffffeb8);
            if (((double)local_c8 == 0.0) && (!NAN((double)local_c8))) {
              iVar7 = *(int *)(local_18 + 4);
              *(int *)(local_18 + 4) = iVar7 + 1;
              pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                                 ((vector<int,_std::allocator<int>_> *)(local_18 + 8),(long)iVar7);
              *pvVar5 = iVar1;
            }
            in_stack_fffffffffffffe98 = local_d0;
            if (ABS((double)local_d0) < 1e-14) {
              in_stack_fffffffffffffe98 = (HVectorBase<double> *)0x358dee7a4ad4b81f;
            }
            in_stack_fffffffffffffea0 = in_stack_fffffffffffffe98;
            pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                               ((vector<double,_std::allocator<double>_> *)(local_18 + 0x20),
                                (long)local_bc);
            *pvVar4 = (value_type)in_stack_fffffffffffffe98;
          }
        }
        else {
          pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                             ((vector<int,_std::allocator<int>_> *)
                              &(in_RDI->
                               super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>).
                               _M_impl.super__Vector_impl_data._M_end_of_storage,(long)local_90);
          for (local_b4 = *pvVar2; local_b4 < local_94; local_b4 = local_b4 + 1) {
            pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                               ((vector<int,_std::allocator<int>_> *)
                                &in_RDI[2].
                                 super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage,(long)local_b4);
            in_stack_fffffffffffffecc = *pvVar2;
            in_stack_fffffffffffffec0 = local_b0;
            std::vector<double,_std::allocator<double>_>::operator[]
                      ((vector<double,_std::allocator<double>_> *)
                       &in_RDI[3].super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage,(long)local_b4);
            HighsSparseVectorSum::add
                      ((HighsSparseVectorSum *)in_stack_fffffffffffffea0,
                       (HighsInt)((ulong)in_stack_fffffffffffffe98 >> 0x20),
                       (double)in_stack_fffffffffffffe90);
          }
        }
      }
      local_80 = local_8c + 1;
    }
  }
  if ((local_9 & 1) != 0) {
    HighsSparseVectorSum::
    cleanup<HighsSparseMatrix::priceByRowWithSwitch(bool,HVectorBase<double>&,HVectorBase<double>const&,double,int,double,int)const::__0>
              ((HighsSparseVectorSum *)in_stack_fffffffffffffea0,
               (anon_class_1_0_00000001 *)in_stack_fffffffffffffe98);
  }
  if (local_80 < *(int *)(local_20 + 4)) {
    if ((local_9 & 1) == 0) {
      priceByRowDenseResult
                ((HighsSparseMatrix *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                 (vector<double,_std::allocator<double>_> *)
                 CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8),
                 in_stack_fffffffffffffec0,(HighsInt)((ulong)in_stack_fffffffffffffeb8 >> 0x20),
                 (HighsInt)in_stack_fffffffffffffeb8);
      *(undefined4 *)(local_18 + 4) = 0;
      for (local_104 = 0;
          local_104 <
          *(int *)((long)&(in_RDI->super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>).
                          _M_impl.super__Vector_impl_data._M_start + 4); local_104 = local_104 + 1)
      {
        pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)(local_18 + 0x20),
                            (long)local_104);
        if (1e-14 <= ABS(*pvVar4)) {
          iVar1 = *(int *)(local_18 + 4);
          *(int *)(local_18 + 4) = iVar1 + 1;
          iVar7 = local_104;
          pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                             ((vector<int,_std::allocator<int>_> *)(local_18 + 8),(long)iVar1);
          *pvVar5 = iVar7;
        }
        else {
          pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                             ((vector<double,_std::allocator<double>_> *)(local_18 + 0x20),
                              (long)local_104);
          *pvVar4 = 0.0;
        }
      }
    }
    else {
      std::vector<HighsCDouble,_std::allocator<HighsCDouble>_>::vector
                ((vector<HighsCDouble,_std::allocator<HighsCDouble>_> *)in_stack_fffffffffffffec0,
                 in_stack_fffffffffffffeb8);
      priceByRowDenseResult
                ((HighsSparseMatrix *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                 in_RDI,(HVector *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                 in_stack_fffffffffffffecc,in_stack_fffffffffffffec8);
      *(undefined4 *)(local_18 + 4) = 0;
      for (local_f4 = 0;
          local_f4 <
          *(int *)((long)&(in_RDI->super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>).
                          _M_impl.super__Vector_impl_data._M_start + 4); local_f4 = local_f4 + 1) {
        this_00 = std::vector<HighsCDouble,_std::allocator<HighsCDouble>_>::operator[]
                            (&local_f0,(long)local_f4);
        pvVar8 = (vector<HighsCDouble,_std::allocator<HighsCDouble>_> *)
                 HighsCDouble::operator_cast_to_double(this_00);
        if (1e-14 <= ABS((double)pvVar8)) {
          pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                             ((vector<double,_std::allocator<double>_> *)(local_18 + 0x20),
                              (long)local_f4);
          *pvVar4 = (value_type)pvVar8;
          iVar1 = *(int *)(local_18 + 4);
          *(int *)(local_18 + 4) = iVar1 + 1;
          iVar7 = local_f4;
          pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                             ((vector<int,_std::allocator<int>_> *)(local_18 + 8),(long)iVar1);
          *pvVar5 = iVar7;
        }
        else {
          pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                             ((vector<double,_std::allocator<double>_> *)(local_18 + 0x20),
                              (long)local_f4);
          *pvVar4 = 0.0;
          pvVar8 = in_stack_fffffffffffffe80;
        }
        in_stack_fffffffffffffe80 = pvVar8;
      }
      std::vector<HighsCDouble,_std::allocator<HighsCDouble>_>::~vector(in_stack_fffffffffffffe80);
    }
  }
  else if ((local_9 & 1) == 0) {
    HVectorBase<double>::tight(in_stack_fffffffffffffea0);
  }
  else {
    std::vector<int,_std::allocator<int>_>::operator=
              ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffe80,
               (vector<int,_std::allocator<int>_> *)
               CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
    sVar6 = std::vector<int,_std::allocator<int>_>::size
                      ((vector<int,_std::allocator<int>_> *)(local_18 + 8));
    std::vector<int,_std::allocator<int>_>::resize
              (in_stack_fffffffffffffe90,
               CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
    *(int *)(local_18 + 4) = (int)sVar6;
    for (local_118 = 0; local_118 < (int)sVar6; local_118 = local_118 + 1) {
      pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)(local_18 + 8),(long)local_118);
      vVar10 = *pvVar5;
      in_stack_fffffffffffffe70 =
           (HighsSparseVectorSum *)
           HighsSparseVectorSum::getValue(in_stack_fffffffffffffe70,in_stack_fffffffffffffe6c);
      pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(local_18 + 0x20),(long)vVar10)
      ;
      *pvVar4 = (value_type)in_stack_fffffffffffffe70;
    }
  }
  HighsSparseVectorSum::~HighsSparseVectorSum(in_stack_fffffffffffffe70);
  return;
}

Assistant:

void HighsSparseMatrix::priceByRowWithSwitch(
    const bool quad_precision, HVector& result, const HVector& column,
    const double expected_density, const HighsInt from_index,
    const double switch_density, const HighsInt debug_report) const {
  assert(this->isRowwise());
  HighsSparseVectorSum sum;
  // todo @Julian: Setting up the sparse vector sum is equivalent to calling
  // HVector::setup() I think there should instead be overloads where the result
  // vector is of type HVectorQuad for the future and not the boolean parameter
  // quad_precision. Then the buffer can be maintained similar to row_ap.
  if (quad_precision) sum.setDimension(num_col_);
  if (debug_report >= kDebugReportAll)
    printf("\nHighsSparseMatrix::priceByRowWithSwitch\n");
  // (Continue) hyper-sparse row-wise PRICE with possible switches to
  // standard row-wise PRICE either immediately based on historical
  // density or during hyper-sparse PRICE if there is too much fill-in
  HighsInt next_index = from_index;
  // Possibly don't perform hyper-sparse PRICE based on historical density
  //
  // Ensure that result was set up for this number of columns, and
  // that result.index is still of correct size
  assert(HighsInt(result.size) == this->num_col_);
  assert(HighsInt(result.index.size()) == this->num_col_);
  if (expected_density <= kHyperPriceDensity) {
    double inv_num_col = 1.0 / this->num_col_;
    for (HighsInt ix = next_index; ix < column.count; ix++) {
      HighsInt iRow = column.index[ix];
      // Determine whether p_end_ or the next start_ ends the loop
      HighsInt to_iEl;
      if (this->format_ == MatrixFormat::kRowwisePartitioned) {
        to_iEl = this->p_end_[iRow];
      } else {
        to_iEl = this->start_[iRow + 1];
      }
      // Possibly switch to standard row-wise price
      HighsInt row_num_nz = to_iEl - this->start_[iRow];
      double local_density = (1.0 * result.count) * inv_num_col;
      bool switch_to_dense = result.count + row_num_nz >= this->num_col_ ||
                             local_density > switch_density;
      if (switch_to_dense) break;
      double multiplier = column.array[iRow];
      if (debug_report == kDebugReportAll || debug_report == iRow)
        debugReportRowPrice(iRow, multiplier, to_iEl, result.array);
      if (multiplier) {
        if (quad_precision) {
          for (HighsInt iEl = this->start_[iRow]; iEl < to_iEl; iEl++) {
            sum.add(this->index_[iEl], multiplier * this->value_[iEl]);
          }
        } else {
          for (HighsInt iEl = this->start_[iRow]; iEl < to_iEl; iEl++) {
            HighsInt iCol = this->index_[iEl];
            double value0 = result.array[iCol];
            double value1 = value0 + multiplier * this->value_[iEl];
            if (value0 == 0) result.index[result.count++] = iCol;
            result.array[iCol] =
                (fabs(value1) < kHighsTiny) ? kHighsZero : value1;
          }
        }
      }
      next_index = ix + 1;
    }
  }
  if (quad_precision)
    sum.cleanup([](HighsInt, double x) { return std::abs(x) <= kHighsTiny; });
  if (next_index < column.count) {
    // PRICE is not complete: finish without maintaining nonzeros of result
    if (quad_precision) {
      std::vector<HighsCDouble> result_array = sum.values;
      this->priceByRowDenseResult(result_array, column, next_index);
      // Determine indices of nonzeros in result
      result.count = 0;
      for (HighsInt iCol = 0; iCol < this->num_col_; iCol++) {
        double value1 = (double)result_array[iCol];
        if (fabs(value1) < kHighsTiny) {
          result.array[iCol] = 0;
        } else {
          result.array[iCol] = value1;
          result.index[result.count++] = iCol;
        }
      }
    } else {
      this->priceByRowDenseResult(result.array, column, next_index);
      // Determine indices of nonzeros in result
      result.count = 0;
      for (HighsInt iCol = 0; iCol < this->num_col_; iCol++) {
        double value1 = result.array[iCol];
        if (fabs(value1) < kHighsTiny) {
          result.array[iCol] = 0;
        } else {
          result.index[result.count++] = iCol;
        }
      }
    }
  } else {
    if (quad_precision) {
      // HVector result should have result.index of size this->num_col_
      // by virtue of result.setup. However, it will generally lose
      // this property by virtue of the following move
      result.index = std::move(sum.nonzeroinds);
      HighsInt result_num_nz = result.index.size();
      // Restore the size of result.index
      result.index.resize(this->num_col_);
      result.count = result_num_nz;
      for (HighsInt i = 0; i < result_num_nz; ++i) {
        HighsInt iRow = result.index[i];
        result.array[iRow] = sum.getValue(iRow);
      }
    } else {
      // PRICE is complete maintaining nonzeros of result
      // Remove small values
      result.tight();
    }
  }
}